

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

cmDependInformation * __thiscall
anon_unknown.dwarf_14be912::cmLBDepend::GetDependInformation
          (cmLBDepend *this,string *file,string *extraPath)

{
  _Base_ptr *__k;
  DirectoryToFileToPathMapType *this_00;
  _Rb_tree_header *__x;
  size_t *psVar1;
  pointer pbVar2;
  default_delete<(anonymous_namespace)::cmDependInformation> *this_01;
  undefined1 auVar3 [16];
  _Rb_tree_header *p_Var4;
  bool bVar5;
  int iVar6;
  byte extraout_var;
  iterator iVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  iterator iVar11;
  cmDependInformation *__s;
  iterator iVar12;
  cmDependInformation *this_02;
  _Base_ptr p_Var13;
  _Alloc_hider in_RCX;
  _Base_ptr p_Var14;
  pointer pcVar15;
  cmDependInformation *__ptr;
  DependInformationMapType *this_03;
  pointer pbVar16;
  _Rb_tree_node_base *p_Var17;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar18;
  string path;
  string fullPath;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  DirectoryToFileToPathMapType *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->DirectoryToFileToPathMap;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::find(&this_00->_M_t,extraPath);
  if (((_Rb_tree_header *)iVar7._M_node ==
       &(this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header) ||
     (iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(iVar7._M_node + 2,file),
     iVar8._M_node == (_Base_ptr)&iVar7._M_node[2]._M_parent)) {
    bVar5 = cmsys::SystemTools::FileExists(file,true);
    if (!bVar5) {
      pbVar16 = (this->IncludeDirectories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = this_00;
      if (pbVar16 != pbVar2) {
        do {
          pcVar15 = (pbVar16->_M_dataplus)._M_p;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,pcVar15,pcVar15 + pbVar16->_M_string_length);
          if ((local_98._M_string_length != 0) &&
             (in_RCX._M_p = local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p[local_98._M_string_length - 1] != '/')) {
            std::__cxx11::string::append((char *)&local_98);
          }
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)(file->_M_dataplus)._M_p);
          bVar5 = cmsys::SystemTools::FileExists(&local_98,true);
          if ((bVar5) && (bVar5 = cmsys::SystemTools::FileIsDirectory(&local_98), !bVar5)) {
            cmsys::SystemTools::CollapseFullPath((string *)&local_78,&local_98);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     ::operator[](local_58,extraPath);
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](pmVar9,file);
            std::__cxx11::string::_M_assign((string *)pmVar10);
            goto LAB_003b946e;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          pbVar16 = pbVar16 + 1;
        } while (pbVar16 != pbVar2);
      }
      if (extraPath->_M_string_length != 0) {
        pcVar15 = (extraPath->_M_dataplus)._M_p;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar15,pcVar15 + extraPath->_M_string_length);
        if ((local_98._M_string_length != 0) &&
           (local_98._M_dataplus._M_p[local_98._M_string_length - 1] != '/')) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          std::__cxx11::string::append((char *)&local_50);
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+(&local_50,&local_98,file);
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar5 = cmsys::SystemTools::FileExists(&local_98,true);
        if ((bVar5) && (bVar5 = cmsys::SystemTools::FileIsDirectory(&local_98), !bVar5)) {
          cmsys::SystemTools::CollapseFullPath((string *)&local_78,&local_98);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   ::operator[](local_58,extraPath);
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar9,file);
          std::__cxx11::string::_M_assign((string *)pmVar10);
LAB_003b946e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          goto LAB_003b91ad;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar15 = (file->_M_dataplus)._M_p;
      p_Var14 = (_Base_ptr)file->_M_string_length;
      goto LAB_003b91a0;
    }
    cmsys::SystemTools::CollapseFullPath((string *)&local_78,file);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             ::operator[](this_00,extraPath);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pmVar9,file);
    std::__cxx11::string::_M_assign((string *)pmVar10);
  }
  else {
    in_RCX._M_p = (pointer)&local_68;
    pcVar15 = *(pointer *)(iVar8._M_node + 2);
    p_Var14 = iVar8._M_node[2]._M_parent;
LAB_003b91a0:
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar15,(pointer)((long)&p_Var14->_M_color + (long)pcVar15));
  }
LAB_003b91ad:
  __x = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header;
  iVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&local_78,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  iVar12._M_node = &__x->_M_header;
  if (((_Rb_tree_header *)iVar11._M_node != __x) &&
     (iVar6 = std::__cxx11::string::compare((string *)local_78._M_local_buf), iVar12 = iVar11,
     iVar6 < 0)) {
    iVar12._M_node = &__x->_M_header;
  }
  if ((_Rb_tree_header *)iVar12._M_node != __x) {
    __s = *(cmDependInformation **)(iVar12._M_node + 2);
    goto LAB_003b954d;
  }
  __s = (cmDependInformation *)operator_new(0xa0);
  p_Var4 = &(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header;
  memset(__s,0,0xa0);
  *(_Rb_tree_header **)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x10) =
       p_Var4;
  *(_Rb_tree_header **)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x18) =
       p_Var4;
  *(size_t *)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x20) = 0;
  __s->DependDone = false;
  __s->SourceFile = (cmSourceFile *)0x0;
  (__s->FullPath)._M_dataplus._M_p = (pointer)&(__s->FullPath).field_2;
  (__s->FullPath)._M_string_length = 0;
  (__s->FullPath).field_2._M_local_buf[0] = '\0';
  (__s->PathOnly)._M_dataplus._M_p = (pointer)&(__s->PathOnly).field_2;
  (__s->PathOnly)._M_string_length = 0;
  (__s->PathOnly).field_2._M_local_buf[0] = '\0';
  (__s->IncludeName)._M_dataplus._M_p = (pointer)&(__s->IncludeName).field_2;
  (__s->IncludeName)._M_string_length = 0;
  (__s->IncludeName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&__s->FullPath);
  cmsys::SystemTools::GetFilenamePath(&local_98,(string *)&local_78);
  std::__cxx11::string::operator=((string *)&__s->PathOnly,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&__s->IncludeName);
  iVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&local_78,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  if ((_Rb_tree_header *)iVar12._M_node == __x) {
LAB_003b9306:
    this_02 = (cmDependInformation *)operator_new(0x48);
    __k = &(this_02->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (this_02->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)&this_02->DependDone;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__k,local_78._M_allocated_capacity,
               local_78._8_8_ + local_78._M_allocated_capacity);
    this_03 = &this->DependInformationMap;
    (this_02->FullPath)._M_dataplus._M_p = (pointer)0x0;
    if ((_Rb_tree_header *)iVar12._M_node == __x) {
      if (((this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (__ptr = (cmDependInformation *)__k,
         iVar6 = std::__cxx11::string::compare
                           ((string *)
                            ((this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_right + 1)), -1 < iVar6)) {
LAB_003b94bf:
        __ptr = (cmDependInformation *)__k;
        pVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                 ::_M_get_insert_unique_pos(&this_03->_M_t,(key_type *)__k);
      }
      else {
        p_Var13 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
        ;
LAB_003b94db:
        auVar3._8_8_ = 0;
        auVar3._0_8_ = p_Var13;
        pVar18 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar3 << 0x40);
      }
    }
    else {
      __ptr = (cmDependInformation *)(iVar12._M_node + 1);
      local_58 = (DirectoryToFileToPathMapType *)this_03;
      iVar6 = std::__cxx11::string::compare((string *)__k);
      if (iVar6 < 0) {
        p_Var13 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pVar18.second = p_Var13;
        pVar18.first = p_Var13;
        if (p_Var13 != iVar12._M_node) {
          p_Var13 = (_Base_ptr)std::_Rb_tree_decrement(iVar12._M_node);
          __ptr = (cmDependInformation *)__k;
          iVar6 = std::__cxx11::string::compare((string *)(p_Var13 + 1));
          this_03 = (DependInformationMapType *)local_58;
          if (-1 < iVar6) goto LAB_003b94bf;
          iVar11 = iVar12;
          if (p_Var13->_M_right == (_Base_ptr)0x0) {
            iVar11._M_node = (_Base_ptr)0x0;
            iVar12._M_node = p_Var13;
          }
LAB_003b94ee:
          pVar18.second = iVar12._M_node;
          pVar18.first = iVar11._M_node;
        }
      }
      else {
        __ptr = (cmDependInformation *)__k;
        iVar6 = std::__cxx11::string::compare((string *)(iVar12._M_node + 1));
        if (iVar6 < 0) {
          p_Var13 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_right;
          if (p_Var13 == iVar12._M_node) goto LAB_003b94db;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(iVar12._M_node);
          __ptr = (cmDependInformation *)(p_Var13 + 1);
          iVar6 = std::__cxx11::string::compare((string *)__k);
          this_03 = (DependInformationMapType *)local_58;
          if (iVar6 < 0) {
            iVar11._M_node = (iVar12._M_node)->_M_right;
            if ((iVar12._M_node)->_M_right != (_Base_ptr)0x0) {
              iVar11._M_node = p_Var13;
              iVar12._M_node = p_Var13;
            }
            goto LAB_003b94ee;
          }
          goto LAB_003b94bf;
        }
        pVar18.second = (_Rb_tree_node_base *)0x0;
        pVar18.first = iVar12._M_node;
      }
    }
    p_Var17 = pVar18.second;
    iVar12._M_node = pVar18.first;
    if (p_Var17 == (_Rb_tree_node_base *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
      ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                      *)this_02,(_Link_type)__ptr);
    }
    else {
      bVar5 = true;
      if (((cmDependInformation *)iVar12._M_node == (cmDependInformation *)0x0) &&
         (__x != (_Rb_tree_header *)p_Var17)) {
        std::__cxx11::string::compare((string *)__k);
        bVar5 = (bool)(extraout_var >> 7);
      }
      __ptr = this_02;
      std::_Rb_tree_insert_and_rebalance
                (bVar5,(_Rb_tree_node_base *)this_02,p_Var17,&__x->_M_header);
      psVar1 = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar1 = *psVar1 + 1;
      iVar12._M_node = (_Base_ptr)this_02;
    }
  }
  else {
    __ptr = (cmDependInformation *)(iVar12._M_node + 1);
    iVar6 = std::__cxx11::string::compare((string *)local_78._M_local_buf);
    if (iVar6 < 0) goto LAB_003b9306;
  }
  this_01 = (default_delete<(anonymous_namespace)::cmDependInformation> *)
            (((cmDependInformation *)iVar12._M_node)->FullPath)._M_dataplus._M_p;
  (((cmDependInformation *)iVar12._M_node)->FullPath)._M_dataplus._M_p = (pointer)__s;
  if (this_01 != (default_delete<(anonymous_namespace)::cmDependInformation> *)0x0) {
    std::default_delete<(anonymous_namespace)::cmDependInformation>::operator()(this_01,__ptr);
  }
LAB_003b954d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  return __s;
}

Assistant:

cmDependInformation* GetDependInformation(const std::string& file,
                                            const std::string& extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    auto result = this->DependInformationMap.find(fullPath);
    if (result != this->DependInformationMap.end()) {
      // Found an instance, return it.
      return result->second.get();
    }
    // Didn't find an instance.  Create a new one and save it.
    auto info = cm::make_unique<cmDependInformation>();
    auto* ptr = info.get();
    info->FullPath = fullPath;
    info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
    info->IncludeName = file;
    this->DependInformationMap[fullPath] = std::move(info);
    return ptr;
  }